

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_missing_file.c
# Opt level: O1

void test_missing_file(void)

{
  wchar_t wVar1;
  char *invalid_stderr [2];
  char *local_28;
  undefined8 uStack_20;
  
  local_28 = "INTERNAL ERROR";
  uStack_20 = 0;
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_missing_file.c"
                      ,L'\f',"file1",L'Ƥ',L'\xffffffff',"file1");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_missing_file.c"
                      ,L'\r',"file2",L'Ƥ',L'\xffffffff',"file2");
  wVar1 = systemf("%s -cf archive.tar file1 file2 2>stderr1",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_missing_file.c"
                   ,L'\x0e',(uint)(wVar1 == L'\0'),
                   "0 == systemf(\"%s -cf archive.tar file1 file2 2>stderr1\", testprog)",
                   (void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_missing_file.c"
             ,L'\x0f',"stderr1");
  wVar1 = systemf("%s -cf archive.tar file1 file2 file3 2>stderr2",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_missing_file.c"
                   ,L'\x10',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -cf archive.tar file1 file2 file3 2>stderr2\", testprog)",
                   (void *)0x0);
  assertion_file_contains_no_invalid_strings
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_missing_file.c"
             ,L'\x11',"stderr2",&local_28);
  wVar1 = systemf("%s -cf archive.tar 2>stderr3",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_missing_file.c"
                   ,L'\x12',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -cf archive.tar 2>stderr3\", testprog)",(void *)0x0);
  assertion_file_contains_no_invalid_strings
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_missing_file.c"
             ,L'\x13',"stderr3",&local_28);
  wVar1 = systemf("%s -cf archive.tar file3 file4 2>stderr4",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_missing_file.c"
                   ,L'\x14',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -cf archive.tar file3 file4 2>stderr4\", testprog)",
                   (void *)0x0);
  assertion_file_contains_no_invalid_strings
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_missing_file.c"
             ,L'\x15',"stderr4",&local_28);
  return;
}

Assistant:

DEFINE_TEST(test_missing_file)
{
	const char * invalid_stderr[] = { "INTERNAL ERROR", NULL };
	assertMakeFile("file1", 0644, "file1");
	assertMakeFile("file2", 0644, "file2");
	assert(0 == systemf("%s -cf archive.tar file1 file2 2>stderr1", testprog));
	assertEmptyFile("stderr1");
	assert(0 != systemf("%s -cf archive.tar file1 file2 file3 2>stderr2", testprog));
	assertFileContainsNoInvalidStrings("stderr2", invalid_stderr);
	assert(0 != systemf("%s -cf archive.tar 2>stderr3", testprog));
	assertFileContainsNoInvalidStrings("stderr3", invalid_stderr);
	assert(0 != systemf("%s -cf archive.tar file3 file4 2>stderr4", testprog));
	assertFileContainsNoInvalidStrings("stderr4", invalid_stderr);
}